

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

Font __thiscall lunasvg::SVGLayoutState::font(SVGLayoutState *this)

{
  bool bVar1;
  size_type __n;
  size_type __n_00;
  const_reference pvVar2;
  string_view *psVar3;
  long in_RSI;
  bool italic_00;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar4 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  Font FVar6;
  bool local_99;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  undefined1 local_68 [23];
  value_type quote;
  basic_string_view<char,_std::char_traits<char>_> family;
  undefined1 local_38 [8];
  string_view input;
  FontFace face;
  bool italic;
  bool bold;
  SVGLayoutState *this_local;
  
  italic_00 = *(char *)(in_RSI + 0xbc) == '\x01';
  FontFace::FontFace((FontFace *)&input._M_str);
  auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RSI + 0x168));
  while( true ) {
    input._M_len = auVar4._8_8_;
    local_38 = auVar4._0_8_;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    local_99 = false;
    if (!bVar1) {
      local_99 = FontFace::isNull((FontFace *)&input._M_str);
    }
    if (local_99 == false) break;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38,',',0);
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38,0,__n);
    family._M_len = (size_t)bVar5._M_str;
    register0x00000000 = (_Base_ptr)bVar5._M_len;
    __n_00 = std::basic_string_view<char,_std::char_traits<char>_>::length
                       ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10));
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)local_38,__n_00);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    if ((!bVar1) &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_38),
       *pvVar2 == ',')) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)local_38,1);
    }
    stripLeadingAndTrailingSpaces((string_view *)(local_68 + 0x10));
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10));
    if ((!bVar1) &&
       ((pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                            ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10)),
        *pvVar2 == '\'' ||
        (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                            ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10)),
        *pvVar2 == '\"')))) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10));
      local_68[0xf] = *pvVar2;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10),1);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10));
      if ((!bVar1) &&
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back
                             ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10))
         , *pvVar2 == local_68[0xf])) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x10),1);
      }
      stripLeadingAndTrailingSpaces((string_view *)(local_68 + 0x10));
    }
    psVar3 = (string_view *)fontFaceCache();
    FontFaceCache::getFontFace
              ((FontFaceCache *)local_68,psVar3,(bool)((char)local_68 + '\x10'),italic_00);
    FontFace::operator=((FontFace *)&input._M_str,(FontFace *)local_68);
    FontFace::~FontFace((FontFace *)local_68);
    auVar4._8_8_ = input._M_len;
    auVar4._0_8_ = local_38;
  }
  bVar1 = FontFace::isNull((FontFace *)&input._M_str);
  if (bVar1) {
    psVar3 = (string_view *)fontFaceCache();
    local_80 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)emptyString_abi_cxx11_);
    FontFaceCache::getFontFace((FontFaceCache *)local_70,psVar3,SUB81(local_80,0),italic_00);
    FontFace::operator=((FontFace *)&input._M_str,(FontFace *)local_70);
    FontFace::~FontFace((FontFace *)local_70);
  }
  Font::Font((Font *)this,(FontFace *)&input._M_str,*(float *)(in_RSI + 0x7c));
  FontFace::~FontFace((FontFace *)&input._M_str);
  FVar6._8_8_ = extraout_XMM0_Qa;
  FVar6.m_face.m_face = (plutovg_font_face_t *)this;
  return FVar6;
}

Assistant:

Font SVGLayoutState::font() const
{
    auto bold = m_font_weight == FontWeight::Bold;
    auto italic = m_font_style == FontStyle::Italic;

    FontFace face;
    std::string_view input(m_font_family);
    while(!input.empty() && face.isNull()) {
        auto family = input.substr(0, input.find(','));
        input.remove_prefix(family.length());
        if(!input.empty() && input.front() == ',')
            input.remove_prefix(1);
        stripLeadingAndTrailingSpaces(family);
        if(!family.empty() && (family.front() == '\'' || family.front() == '"')) {
            auto quote = family.front();
            family.remove_prefix(1);
            if(!family.empty() && family.back() == quote)
                family.remove_suffix(1);
            stripLeadingAndTrailingSpaces(family);
        }

        face = fontFaceCache()->getFontFace(family, bold, italic);
    }

    if(face.isNull())
        face = fontFaceCache()->getFontFace(emptyString, bold, italic);
    return Font(face, m_font_size);
}